

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

bool __thiscall Disa::Matrix_Sparse::contains(Matrix_Sparse *this,size_t *i_row,size_t *i_column)

{
  size_t *psVar1;
  bool local_91;
  value_type local_90;
  value_type local_80;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_70;
  iterator local_60;
  undefined1 local_40 [8];
  const_iterator_element iter_element;
  size_t *i_column_local;
  size_t *i_row_local;
  Matrix_Sparse *this_local;
  
  iter_element.matrix = (matrix_type *)i_column;
  find((const_iterator_element *)local_40,this,i_row,i_column);
  psVar1 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row
                     ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_40);
  local_91 = false;
  if (*psVar1 == *i_row) {
    local_90 = (value_type)begin(this);
    local_80 = (value_type)
               Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator+
                         ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_90,*i_row)
    ;
    local_70 = Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator*
                         ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)&local_80);
    Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_60,&local_70);
    local_91 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                         ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_40,
                          &local_60);
  }
  return local_91;
}

Assistant:

bool Matrix_Sparse::contains(const std::size_t& i_row, const std::size_t& i_column) const {
  const auto iter_element = find(i_row, i_column);
  return iter_element.i_row() == i_row && iter_element != (*(begin() + static_cast<s_size_t>(i_row))).end();
}